

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

Vec_Int_t * Acb_ObjCollectTfi(Acb_Ntk_t *p,int iObj,int fTerm)

{
  int iVar1;
  int local_1c;
  int Node;
  int i;
  int fTerm_local;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  Vec_IntClear(&p->vArray0);
  Acb_NtkIncTravId(p);
  if (iObj < 1) {
    for (local_1c = 0; iVar1 = Acb_NtkCoNum(p), local_1c < iVar1; local_1c = local_1c + 1) {
      iVar1 = Acb_NtkCo(p,local_1c);
      Acb_ObjCollectTfi_rec(p,iVar1,fTerm);
    }
  }
  else {
    for (local_1c = 0; iVar1 = Vec_IntSize(&p->vSuppOld), local_1c < iVar1; local_1c = local_1c + 1)
    {
      iVar1 = Vec_IntEntry(&p->vSuppOld,local_1c);
      Acb_ObjCollectTfi_rec(p,iVar1,fTerm);
    }
    Acb_ObjCollectTfi_rec(p,iObj,fTerm);
  }
  return &p->vArray0;
}

Assistant:

Vec_Int_t * Acb_ObjCollectTfi( Acb_Ntk_t * p, int iObj, int fTerm )
{
    int i, Node;
    Vec_IntClear( &p->vArray0 );
    Acb_NtkIncTravId( p );
    if ( iObj > 0 )
    {
        Vec_IntForEachEntry( &p->vSuppOld, Node, i )
            Acb_ObjCollectTfi_rec( p, Node, fTerm );
        Acb_ObjCollectTfi_rec( p, iObj, fTerm );
    }
    else
        Acb_NtkForEachCo( p, iObj, i )
            Acb_ObjCollectTfi_rec( p, iObj, fTerm );
    return &p->vArray0;
}